

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabinkarphash.h
# Opt level: O1

uint __thiscall
KarpRabinHash<unsigned_int,unsigned_char>::
hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (KarpRabinHash<unsigned_int,unsigned_char> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  uint uVar1;
  pointer puVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  puVar2 = (c->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(c->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar2;
  if (uVar5 == 0) {
    return 0;
  }
  uVar1 = *(uint *)(this + 0x40c);
  uVar6 = 0;
  uVar4 = 0;
  do {
    if (~uVar6 + uVar5 == 0) {
      uVar7 = 1;
    }
    else {
      uVar7 = 1;
      uVar8 = 1;
      do {
        uVar7 = uVar7 * 0x25 & uVar1;
        bVar3 = uVar8 < ~uVar6 + uVar5;
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (bVar3);
    }
    uVar4 = uVar4 + (uVar7 * *(int *)(this + (ulong)puVar2[uVar6] * 4 + 0xc) & uVar1) & uVar1;
    uVar6 = uVar6 + 1;
  } while ((uVar6 & 0xffffffff) < uVar5);
  return uVar4;
}

Assistant:

hashvaluetype hash(container &c) {
    hashvaluetype answer(0);
    for (uint k = 0; k < c.size(); ++k) {
      hashvaluetype x(1);
      for (uint j = 0; j < c.size() - 1 - k; ++j) {
        x = (x * B) & HASHMASK;
      }
      x = (x * hasher.hashvalues[c[k]]) & HASHMASK;
      answer = (answer + x) & HASHMASK;
    }
    return answer;
  }